

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOWriter.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOWriter::~TcpASIOWriter(TcpASIOWriter *this)

{
  long *plVar1;
  void *pvVar2;
  Selector *in_RDI;
  
  ((Mutex *)&in_RDI->_vptr_Selector)->_vptr_Mutex = (_func_int **)&PTR__TcpASIOWriter_00126be8;
  if (in_RDI[1].m_rdfs.fds_bits[4] == 0) {
    if ((in_RDI[1].m_rdfs.fds_bits[0] != 0) &&
       (plVar1 = (long *)in_RDI[1].m_rdfs.fds_bits[0], plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((in_RDI[1].m_rdfs.fds_bits[1] != 0) &&
       (pvVar2 = (void *)in_RDI[1].m_rdfs.fds_bits[1], pvVar2 != (void *)0x0)) {
      std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::~list
                ((list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x11cd8c
                );
      operator_delete(pvVar2);
    }
  }
  plVar1 = (long *)in_RDI[1].m_writeUpdated.super__List_base<int,_std::allocator<int>_>._M_impl.
                   _M_node._M_size;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  CondVar::~CondVar((CondVar *)in_RDI);
  Selector::~Selector(in_RDI);
  IRunnable::~IRunnable((IRunnable *)in_RDI);
  return;
}

Assistant:

TcpASIOWriter::~TcpASIOWriter()
  {
    if (m_server == NULL) {
      if (m_mutex != NULL)
	delete (m_mutex);
      if (m_socketList != NULL)
	delete (m_socketList);
    }
    delete (m_thread);
  }